

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ConvertToSampledImagePass::FindUsesOfImage
          (ConvertToSampledImagePass *this,Instruction *image,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *uses)

{
  DefUseManager *this_00;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  local_28 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp:222:35)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp:222:35)>
             ::_M_manager;
  local_40._M_unused._M_object = uses;
  local_40._8_8_ = this;
  analysis::DefUseManager::ForEachUser
            (this_00,image,(function<void_(spvtools::opt::Instruction_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void ConvertToSampledImagePass::FindUsesOfImage(
    const Instruction* image, std::vector<Instruction*>* uses) const {
  auto* def_use_mgr = context()->get_def_use_mgr();
  def_use_mgr->ForEachUser(image, [uses, this](Instruction* user) {
    switch (user->opcode()) {
      case spv::Op::OpImageFetch:
      case spv::Op::OpImageRead:
      case spv::Op::OpImageWrite:
      case spv::Op::OpImageQueryFormat:
      case spv::Op::OpImageQueryOrder:
      case spv::Op::OpImageQuerySizeLod:
      case spv::Op::OpImageQuerySize:
      case spv::Op::OpImageQueryLevels:
      case spv::Op::OpImageQuerySamples:
      case spv::Op::OpImageSparseFetch:
        uses->push_back(user);
      default:
        break;
    }
    if (user->opcode() == spv::Op::OpCopyObject) {
      FindUsesOfImage(user, uses);
    }
  });
}